

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

void pair0_sock_recv(void *arg,nni_aio *aio)

{
  nni_lmq *lmq;
  nni_aio *pnVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  int iVar4;
  nni_msg *in_RAX;
  size_t sVar5;
  nni_msg *local_38;
  nni_msg *m;
  
  local_38 = in_RAX;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  puVar2 = *arg;
  lmq = (nni_lmq *)((long)arg + 0x90);
  iVar4 = nni_lmq_get(lmq,&local_38);
  if (iVar4 == 0) {
    nni_aio_set_msg(aio,local_38);
    sVar5 = nni_msg_len(local_38);
    nni_aio_finish(aio,NNG_OK,sVar5);
    if (*(char *)((long)arg + 0x110) == '\x01') {
      *(undefined1 *)((long)arg + 0x110) = 0;
      pnVar1 = (nni_aio *)(puVar2 + 0x3b);
      local_38 = nni_aio_get_msg(pnVar1);
      nni_aio_set_msg(pnVar1,(nni_msg *)0x0);
      nni_lmq_put(lmq,local_38);
      nni_pipe_recv((nni_pipe *)*puVar2,pnVar1);
    }
    _Var3 = nni_lmq_empty(lmq);
    if (!_Var3) goto LAB_00120767;
  }
  else {
    if (*(char *)((long)arg + 0x110) != '\x01') {
      _Var3 = nni_aio_start(aio,pair0_cancel,arg);
      if (_Var3) {
        nni_aio_list_append((nni_list *)((long)arg + 0xd8),aio);
      }
      goto LAB_00120767;
    }
    *(undefined1 *)((long)arg + 0x110) = 0;
    pnVar1 = (nni_aio *)(puVar2 + 0x3b);
    local_38 = nni_aio_get_msg(pnVar1);
    nni_aio_set_msg(pnVar1,(nni_msg *)0x0);
    nni_aio_set_msg(aio,local_38);
    sVar5 = nni_msg_len(local_38);
    nni_aio_finish(aio,NNG_OK,sVar5);
    nni_pipe_recv((nni_pipe *)*puVar2,pnVar1);
  }
  nni_pollable_clear((nni_pollable *)((long)arg + 0xf0));
LAB_00120767:
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return;
}

Assistant:

static void
pair0_sock_recv(void *arg, nni_aio *aio)
{
	pair0_sock *s = arg;
	pair0_pipe *p;
	nni_msg    *m;

	nni_mtx_lock(&s->mtx);
	p = s->p;

	// Buffered read.  If there is a message waiting for us, pick
	// it up.  We might need to post another read request as well.
	if (nni_lmq_get(&s->rmq, &m) == 0) {
		nni_aio_set_msg(aio, m);
		nni_aio_finish(aio, 0, nni_msg_len(m));
		if (s->rd_ready) {
			s->rd_ready = false;
			m           = nni_aio_get_msg(&p->aio_recv);
			nni_aio_set_msg(&p->aio_recv, NULL);
			nni_lmq_put(&s->rmq, m);
			nni_pipe_recv(p->pipe, &p->aio_recv);
		}
		if (nni_lmq_empty(&s->rmq)) {
			nni_pollable_clear(&s->readable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	// Unbuffered -- but waiting.
	if (s->rd_ready) {
		s->rd_ready = false;
		m           = nni_aio_get_msg(&p->aio_recv);
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_aio_set_msg(aio, m);
		nni_aio_finish(aio, 0, nni_msg_len(m));
		nni_pipe_recv(p->pipe, &p->aio_recv);
		nni_pollable_clear(&s->readable);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if (!nni_aio_start(aio, pair0_cancel, s)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_aio_list_append(&s->raq, aio);
	nni_mtx_unlock(&s->mtx);
}